

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder __thiscall
capnp::_::PointerBuilder::initBlob<capnp::Data>(PointerBuilder *this,ByteCount size)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  ArrayPtr<unsigned_char> AVar1;
  uint size_00;
  ThrowOverflow local_41;
  SegmentAnd<capnp::Data::Builder> local_40;
  ByteCount local_24;
  PointerBuilder *pPStack_20;
  ByteCount size_local;
  PointerBuilder *this_local;
  
  ref = this->pointer;
  segment = this->segment;
  capTable = this->capTable;
  local_24 = size;
  pPStack_20 = this;
  size_00 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(size,&local_41);
  WireHelpers::initDataPointer(&local_40,ref,segment,capTable,size_00,(BuilderArena *)0x0);
  AVar1.size_ = local_40.value.super_ArrayPtr<unsigned_char>.size_;
  AVar1.ptr = local_40.value.super_ArrayPtr<unsigned_char>.ptr;
  return (Builder)AVar1;
}

Assistant:

Data::Builder PointerBuilder::initBlob<Data>(ByteCount size) {
  return WireHelpers::initDataPointer(pointer, segment, capTable,
      assertMaxBits<BLOB_SIZE_BITS>(size, ThrowOverflow())).value;
}